

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockCallTest_expectNoCallOnlyFailureOnceWhenMultipleHappened_TestShell::createTest
          (TEST_MockCallTest_expectNoCallOnlyFailureOnceWhenMultipleHappened_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
                                  ,0xe4);
  TEST_MockCallTest_expectNoCallOnlyFailureOnceWhenMultipleHappened_Test::
  TEST_MockCallTest_expectNoCallOnlyFailureOnceWhenMultipleHappened_Test
            ((TEST_MockCallTest_expectNoCallOnlyFailureOnceWhenMultipleHappened_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockCallTest, expectNoCallOnlyFailureOnceWhenMultipleHappened)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "lazy");
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock().expectNoCall("lazy");
    mock().actualCall("lazy");
    mock().actualCall("lazy");
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}